

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SequenceRepetitionSyntax *pSVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  if (*(SelectorSyntax **)((long)__fn + 0x38) != (SelectorSyntax *)0x0) {
    deepClone<slang::syntax::SelectorSyntax>
              ((SelectorSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  }
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SequenceRepetitionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(SelectorSyntax **)__fn,
                      args_3);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SequenceRepetitionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SequenceRepetitionSyntax>(
        node.openBracket.deepClone(alloc),
        node.op.deepClone(alloc),
        node.selector ? deepClone(*node.selector, alloc) : nullptr,
        node.closeBracket.deepClone(alloc)
    );
}